

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.cpp
# Opt level: O3

double __thiscall NetworkNS::RanMars::uniform(RanMars *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  
  uVar1 = this->x;
  uVar3 = this->y << 5 ^ this->y;
  uVar3 = uVar3 >> 7 ^ uVar3;
  uVar3 = uVar3 << 0x16 ^ uVar3;
  uVar4 = (ulong)this->c + (ulong)this->z * 0xfffa2849;
  iVar2 = uVar1 * -0x382ba2f7;
  this->x = iVar2 + 0x7908c672;
  uVar6 = uVar3 << 5 ^ uVar3;
  uVar6 = uVar6 >> 7 ^ uVar6;
  uVar6 = uVar6 << 0x16 ^ uVar6;
  this->y = uVar6;
  lVar5 = (uVar4 & 0xffffffff) * 0xfffa2849 + (uVar4 >> 0x20);
  *(long *)&this->z = lVar5;
  return (double)(CONCAT44((int)uVar4 + uVar1 * 0x12bf507d + uVar3 + 0x12d687,
                           iVar2 + (int)lVar5 + 0x7908c672 + uVar6) >> 0xc | 0x3ff0000000000000) +
         -1.0;
}

Assistant:

unsigned int RanMars::uint_rand()
    {
        unsigned long long t;
        x = 314527869 * x + 1234567;
        y ^= y << 5;
        y ^= y >> 7;
        y ^= y << 22;
        t = 4294584393ULL * z + c;
        c = t >> 32;
        z = t;
        return x + y + z;
    }